

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setop_relation.cpp
# Opt level: O1

string * __thiscall
duckdb::SetOpRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SetOpRelation *this,idx_t depth)

{
  ulong *puVar1;
  size_type *psVar2;
  Relation *pRVar3;
  undefined8 *puVar4;
  InternalException *this_00;
  undefined8 uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string str;
  string local_c8;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  string local_48;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_48,(Relation *)depth,depth);
  if (2 < (byte)(this->setop_type - UNION)) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Unknown setop type","");
    InternalException::InternalException(this_00,&local_c8);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::append((char *)&local_48);
  local_a8 = local_98;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,local_48._M_dataplus._M_p,
             local_48._M_dataplus._M_p + local_48._M_string_length);
  ::std::__cxx11::string::append((char *)&local_a8);
  pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(&this->left);
  (*pRVar3->_vptr_Relation[6])(&local_68,pRVar3,depth + 1);
  uVar6 = 0xf;
  if (local_a8 != local_98) {
    uVar6 = local_98[0];
  }
  if (uVar6 < (ulong)(local_60 + local_a0)) {
    uVar6 = 0xf;
    if (local_68 != local_58) {
      uVar6 = local_58[0];
    }
    if (uVar6 < (ulong)(local_60 + local_a0)) goto LAB_00c67043;
    puVar4 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_a8);
  }
  else {
LAB_00c67043:
    puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  puVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_c8.field_2._M_allocated_capacity = *puVar1;
    local_c8.field_2._8_8_ = puVar4[3];
  }
  else {
    local_c8.field_2._M_allocated_capacity = *puVar1;
    local_c8._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_c8._M_string_length = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(&this->right);
  (*pRVar3->_vptr_Relation[6])(&local_88,pRVar3,depth + 1);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    uVar5 = local_c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_80 + local_c8._M_string_length) {
    uVar6 = 0xf;
    if (local_88 != local_78) {
      uVar6 = local_78[0];
    }
    if (local_80 + local_c8._M_string_length <= uVar6) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_88,0,(char *)0x0,(ulong)local_c8._M_dataplus._M_p);
      goto LAB_00c67126;
    }
  }
  puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_88);
LAB_00c67126:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar2) {
    uVar5 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string SetOpRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth);
	switch (setop_type) {
	case SetOperationType::UNION:
		str += "Union";
		break;
	case SetOperationType::EXCEPT:
		str += "Except";
		break;
	case SetOperationType::INTERSECT:
		str += "Intersect";
		break;
	default:
		throw InternalException("Unknown setop type");
	}
	return str + "\n" + left->ToString(depth + 1) + right->ToString(depth + 1);
}